

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetInput.cpp
# Opt level: O0

void getReplacePolicy(void)

{
  ulong uVar1;
  short local_a [4];
  short temp;
  
  puts("\nInput the replacement policy:");
  puts("\n\t FIFO(First In First Out):input 1");
  puts("\n\t LRU(Least Recently Used):input 2");
  puts("\n\t LFU(Least Frequently Used):input 3");
  puts("\n\t Random:input 4");
  std::istream::operator>>((istream *)&std::cin,local_a);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::sync();
  }
  switch(local_a[0]) {
  case 1:
    t_replace = FIFO;
    break;
  case 2:
    t_replace = LRU;
    break;
  case 3:
    t_replace = LFU;
    break;
  case 4:
    t_replace = Random;
    break;
  default:
    getReplacePolicy();
  }
  return;
}

Assistant:

void getReplacePolicy()
{
	short temp;
	puts("\nInput the replacement policy:");
	puts("\n\t FIFO(First In First Out):input 1");
	puts("\n\t LRU(Least Recently Used):input 2");
	puts("\n\t LFU(Least Frequently Used):input 3");
	puts("\n\t Random:input 4");
	cin >> temp;
	if (cin.fail())
	{
		cin.clear();
		cin.sync();
	}
	switch (temp)
	{
	case 1:
		t_replace = FIFO;
		break;
	case 2:
		t_replace = LRU;
		break;
	case 3:
		t_replace = LFU;
		break;
	case 4:
		t_replace = Random;
		break;
	default:
		getReplacePolicy();
	}
}